

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t archive_read_format_cab_read_header(archive_read *a,archive_entry *entry)

{
  uint16_t uVar1;
  int iVar2;
  cab *cab_00;
  cffolder *pcVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  cffile *pcVar6;
  archive_string_conv *paVar7;
  int *piVar8;
  char *pcVar9;
  wchar_t local_4c;
  wchar_t r;
  wchar_t err;
  archive_string_conv *sconv;
  cffile *file;
  cffolder *prev_folder;
  cfheader *hd;
  cab *cab;
  archive_entry *entry_local;
  archive_read *a_local;
  
  local_4c = L'\0';
  cab_00 = (cab *)a->format->data;
  if (cab_00->found_header == '\0') {
    local_4c = cab_read_header(a);
    if (local_4c < L'\xffffffec') {
      return local_4c;
    }
    cab_00->found_header = '\x01';
  }
  if ((int)(uint)(cab_00->cfheader).file_count <= (cab_00->cfheader).file_index) {
    cab_00->end_of_archive = '\x01';
    return L'\x01';
  }
  iVar2 = (cab_00->cfheader).file_index;
  (cab_00->cfheader).file_index = iVar2 + 1;
  pcVar6 = (cab_00->cfheader).file_array + iVar2;
  cab_00->end_of_entry = '\0';
  cab_00->end_of_entry_cleanup = '\0';
  cab_00->entry_compressed_bytes_read = 0;
  cab_00->entry_uncompressed_bytes_read = 0;
  cab_00->entry_unconsumed = 0;
  cab_00->entry_cffile = pcVar6;
  pcVar3 = cab_00->entry_cffolder;
  uVar1 = pcVar6->folder;
  if (uVar1 != 0xfffd) {
    if (uVar1 == 0xfffe) {
      cab_00->entry_cffolder =
           (cab_00->cfheader).folder_array + (int)((cab_00->cfheader).folder_count - 1);
      goto LAB_00b5fcfe;
    }
    if (uVar1 != 0xffff) {
      cab_00->entry_cffolder = (cab_00->cfheader).folder_array + pcVar6->folder;
      goto LAB_00b5fcfe;
    }
  }
  cab_00->entry_cffolder = (cab_00->cfheader).folder_array;
LAB_00b5fcfe:
  if (pcVar3 != cab_00->entry_cffolder) {
    cab_00->entry_cfdata = (cfdata *)0x0;
  }
  if ((pcVar6->attr & 0x80) == 0) {
    if (cab_00->sconv == (archive_string_conv *)0x0) {
      if (cab_00->init_default_conversion == L'\0') {
        paVar7 = archive_string_default_conversion_for_read(&a->archive);
        cab_00->sconv_default = paVar7;
        cab_00->init_default_conversion = L'\x01';
      }
      _r = cab_00->sconv_default;
    }
    else {
      _r = cab_00->sconv;
    }
  }
  else {
    if (cab_00->sconv_utf8 == (archive_string_conv *)0x0) {
      paVar7 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      cab_00->sconv_utf8 = paVar7;
      if (cab_00->sconv_utf8 == (archive_string_conv *)0x0) {
        return L'\xffffffe2';
      }
    }
    _r = cab_00->sconv_utf8;
  }
  wVar4 = cab_convert_path_separator_1(&pcVar6->pathname,pcVar6->attr);
  wVar5 = _archive_entry_copy_pathname_l(entry,(pcVar6->pathname).s,(pcVar6->pathname).length,_r);
  if (wVar5 != L'\0') {
    piVar8 = __errno_location();
    if (*piVar8 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
      return L'\xffffffe2';
    }
    pcVar9 = archive_string_conversion_charset_name(_r);
    archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                      pcVar9);
    local_4c = L'\xffffffec';
  }
  if (wVar4 < L'\0') {
    cab_convert_path_separator_2(cab_00,entry);
  }
  archive_entry_set_size(entry,(ulong)pcVar6->uncompressed_size);
  if ((pcVar6->attr & 1) == 0) {
    archive_entry_set_mode(entry,0x81b6);
  }
  else {
    archive_entry_set_mode(entry,0x816d);
  }
  archive_entry_set_mtime(entry,pcVar6->mtime,0);
  cab_00->entry_bytes_remaining = (ulong)pcVar6->uncompressed_size;
  cab_00->entry_offset = 0;
  if (pcVar6->uncompressed_size == 0) {
    cab_00->end_of_entry = '\x01';
    cab_00->end_of_entry_cleanup = '\x01';
  }
  sprintf(cab_00->format_name,"CAB %d.%d (%s)",(ulong)(cab_00->cfheader).major,
          (ulong)(cab_00->cfheader).minor,cab_00->entry_cffolder->compname);
  (a->archive).archive_format_name = cab_00->format_name;
  return local_4c;
}

Assistant:

static int
archive_read_format_cab_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct cab *cab;
	struct cfheader *hd;
	struct cffolder *prev_folder;
	struct cffile *file;
	struct archive_string_conv *sconv;
	int err = ARCHIVE_OK, r;
	
	cab = (struct cab *)(a->format->data);
	if (cab->found_header == 0) {
		err = cab_read_header(a); 
		if (err < ARCHIVE_WARN)
			return (err);
		/* We've found the header. */
		cab->found_header = 1;
	}
	hd = &cab->cfheader;

	if (hd->file_index >= hd->file_count) {
		cab->end_of_archive = 1;
		return (ARCHIVE_EOF);
	}
	file = &hd->file_array[hd->file_index++];

	cab->end_of_entry = 0;
	cab->end_of_entry_cleanup = 0;
	cab->entry_compressed_bytes_read = 0;
	cab->entry_uncompressed_bytes_read = 0;
	cab->entry_unconsumed = 0;
	cab->entry_cffile = file;

	/*
	 * Choose a proper folder.
	 */
	prev_folder = cab->entry_cffolder;
	switch (file->folder) {
	case iFoldCONTINUED_FROM_PREV:
	case iFoldCONTINUED_PREV_AND_NEXT:
		cab->entry_cffolder = &hd->folder_array[0];
		break;
	case iFoldCONTINUED_TO_NEXT:
		cab->entry_cffolder = &hd->folder_array[hd->folder_count-1];
		break;
	default:
		cab->entry_cffolder = &hd->folder_array[file->folder];
		break;
	}
	/* If a cffolder of this file is changed, reset a cfdata to read
	 * file contents from next cfdata. */
	if (prev_folder != cab->entry_cffolder)
		cab->entry_cfdata = NULL;

	/* If a pathname is UTF-8, prepare a string conversion object
	 * for UTF-8 and use it. */
	if (file->attr & ATTR_NAME_IS_UTF) {
		if (cab->sconv_utf8 == NULL) {
			cab->sconv_utf8 =
			    archive_string_conversion_from_charset(
				&(a->archive), "UTF-8", 1);
			if (cab->sconv_utf8 == NULL)
				return (ARCHIVE_FATAL);
		}
		sconv = cab->sconv_utf8;
	} else if (cab->sconv != NULL) {
		/* Choose the conversion specified by the option. */
		sconv = cab->sconv;
	} else {
		/* Choose the default conversion. */
		if (!cab->init_default_conversion) {
			cab->sconv_default =
			    archive_string_default_conversion_for_read(
			      &(a->archive));
			cab->init_default_conversion = 1;
		}
		sconv = cab->sconv_default;
	}

	/*
	 * Set a default value and common data
	 */
	r = cab_convert_path_separator_1(&(file->pathname), file->attr);
	if (archive_entry_copy_pathname_l(entry, file->pathname.s,
	    archive_strlen(&(file->pathname)), sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		err = ARCHIVE_WARN;
	}
	if (r < 0) {
		/* Convert a path separator '\' -> '/' */
		cab_convert_path_separator_2(cab, entry);
	}

	archive_entry_set_size(entry, file->uncompressed_size);
	if (file->attr & ATTR_RDONLY)
		archive_entry_set_mode(entry, AE_IFREG | 0555);
	else
		archive_entry_set_mode(entry, AE_IFREG | 0666);
	archive_entry_set_mtime(entry, file->mtime, 0);

	cab->entry_bytes_remaining = file->uncompressed_size;
	cab->entry_offset = 0;
	/* We don't need compress data. */
	if (file->uncompressed_size == 0)
		cab->end_of_entry_cleanup = cab->end_of_entry = 1;

	/* Set up a more descriptive format name. */
	sprintf(cab->format_name, "CAB %d.%d (%s)",
	    hd->major, hd->minor, cab->entry_cffolder->compname);
	a->archive.archive_format_name = cab->format_name;

	return (err);
}